

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ack_thread.cc
# Opt level: O2

void __thiscall AckThread::SendAck(AckThread *this,WaitAckSession *session,QuickAck *ack)

{
  undefined4 uVar1;
  uint6 uVar2;
  uint uVar3;
  ushort uVar4;
  
  uVar3 = session->previous_ack_base_packet_number;
  if (uVar3 == 0xffffffff) {
    uVar3 = (uint)ack->base_pkt_number;
    session->previous_ack_base_packet_number = uVar3;
    uVar4 = ack->pkt_number_mask;
    session->previous_ack_packet_number_mask = (uint)uVar4;
  }
  else {
    uVar4 = (ushort)session->previous_ack_packet_number_mask;
  }
  ack->previous_ack_base_pkt_number = (uint16_t)uVar3;
  ack->previous_ack_pkt_number_mask = uVar4;
  Send(this,&session->dst_ip,session->dst_port,ack,0xf);
  uVar1._0_2_ = ack->base_pkt_number;
  uVar1._2_2_ = ack->pkt_number_mask;
  uVar2 = CONCAT24(uVar1._2_2_,uVar1);
  session->previous_ack_base_packet_number = (int)(ulong)(uVar2 & 0xffff0000ffff);
  session->previous_ack_packet_number_mask = (int)((ulong)(uVar2 & 0xffff0000ffff) >> 0x20);
  return;
}

Assistant:

void AckThread::SendAck(WaitAckSession* session, QuickAck& ack)
{
	if (session->previous_ack_base_packet_number == -1) {
		session->previous_ack_base_packet_number = ack.base_pkt_number;
		session->previous_ack_packet_number_mask = ack.pkt_number_mask;
	}
	ack.previous_ack_base_pkt_number = session->previous_ack_base_packet_number;
	ack.previous_ack_pkt_number_mask = session->previous_ack_packet_number_mask;
	Send(session->dst_ip, session->dst_port, &ack, sizeof(ack));
	session->previous_ack_base_packet_number = ack.base_pkt_number;
	session->previous_ack_packet_number_mask = ack.pkt_number_mask;
}